

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O2

void DrawTextRecEx(Font font,char *text,Rectangle rec,float fontSize,float spacing,_Bool wordWrap,
                  Color tint,int selectStart,int selectLength,Color selectTint,Color selectBackTint)

{
  Vector2 position;
  Color tint_00;
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint codepoint;
  CharInfo *pCVar4;
  int iVar5;
  undefined4 in_register_0000000c;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int tmp;
  ulong uVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  undefined4 in_register_00000084;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  bool bVar17;
  float fVar18;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined4 in_XMM3_Db;
  undefined4 in_XMM3_Dc;
  undefined4 in_XMM3_Dd;
  Rectangle rec_00;
  int local_fc;
  int local_ec;
  ulong local_e8;
  Color local_e0;
  Color local_dc;
  int local_d8;
  int local_d4;
  float local_d0;
  float local_cc;
  float local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  CharInfo *local_b0;
  undefined1 local_a8 [16];
  Rectangle *local_98;
  undefined8 local_90;
  ulong local_88;
  char *local_80;
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_90 = CONCAT44(in_register_00000084,selectLength);
  local_e8 = CONCAT44(in_register_0000000c,selectStart);
  fVar18 = rec.height;
  local_a8._8_4_ = in_XMM1_Dc;
  local_a8._0_8_ = rec._8_8_;
  local_a8._12_4_ = in_XMM1_Dd;
  local_78._8_4_ = in_XMM0_Dc;
  local_78._0_8_ = rec._0_8_;
  local_78._12_4_ = in_XMM0_Dd;
  local_e0 = tint;
  local_dc = selectTint;
  local_cc = spacing;
  local_80 = text;
  uVar2 = TextLength(text);
  bVar10 = !wordWrap;
  uVar8 = 0;
  uVar9 = (ulong)(uint)font.charsCount;
  if (font.charsCount < 1) {
    uVar9 = uVar8;
  }
  local_b0 = font.chars;
  local_98 = font.recs;
  local_d0 = fontSize / (float)font.baseSize;
  iVar3 = (int)((float)(font.baseSize / 2 + font.baseSize) * local_d0);
  local_68 = (float)font.baseSize * local_d0;
  local_88 = (ulong)(uint)(int)local_68;
  local_48 = (float)local_a8._4_4_;
  fStack_44 = (float)local_a8._4_4_;
  fStack_40 = (float)local_a8._4_4_;
  fStack_3c = (float)local_a8._4_4_;
  local_c8 = 0.0;
  uStack_c4 = 0;
  uStack_c0 = 0;
  uStack_bc = 0;
  local_fc = -1;
  iVar5 = -1;
  iVar16 = 0;
  iVar12 = 0;
  fStack_64 = fVar18;
  iVar15 = -1;
  do {
    iVar6 = (int)uVar8;
    if ((int)uVar2 <= iVar6) {
      return;
    }
    local_ec = 0;
    codepoint = GetNextCodepoint(local_80 + iVar6,&local_ec);
    pCVar4 = local_b0;
    for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      if (pCVar4->value == codepoint) goto LAB_0012a341;
      pCVar4 = pCVar4 + 1;
    }
    uVar8 = 0x3f;
LAB_0012a341:
    iVar11 = iVar15;
    if (codepoint == 0x3f) {
      iVar7 = 1;
      iVar13 = iVar6;
LAB_0012a399:
      if (local_b0[uVar8].advanceX == 0) {
        fVar18 = local_98[uVar8].width;
      }
      else {
        fVar18 = (float)local_b0[uVar8].advanceX;
      }
      iVar14 = (int)(fVar18 * local_d0 + local_cc);
      if (bVar10) {
        if ((!wordWrap) && ((float)local_a8._0_4_ <= (float)iVar14 + local_c8 + 1.0)) {
          iVar12 = iVar12 + iVar3;
          local_c8 = 0.0;
          uStack_c4 = 0;
          uStack_c0 = 0;
          uStack_bc = 0;
        }
        if (local_48 < (float)((int)local_88 + iVar12)) {
          return;
        }
        iVar6 = (int)local_e8;
        bVar17 = iVar6 <= iVar16;
        bVar10 = iVar16 < (int)local_90 + iVar6;
        fVar18 = (float)iVar12;
        if (bVar10 && (bVar17 && -1 < iVar6)) {
          rec_00.x = (float)local_78._0_4_ + local_c8 + -1.0;
          rec_00.y = fVar18 + (float)local_78._4_4_;
          rec_00.width = (float)iVar14;
          rec_00.height = local_68;
          local_d8 = iVar5;
          local_d4 = iVar16;
          local_58 = fVar18;
          uStack_54 = in_XMM3_Db;
          uStack_50 = in_XMM3_Dc;
          uStack_4c = in_XMM3_Dd;
          DrawRectangleRec(rec_00,selectBackTint);
          fVar18 = local_58;
          in_XMM3_Db = uStack_54;
          in_XMM3_Dc = uStack_50;
          in_XMM3_Dd = uStack_4c;
          iVar16 = local_d4;
          iVar5 = local_d8;
        }
        if ((codepoint != 9) && (codepoint != 0x20)) {
          tint_00 = local_e0;
          if (bVar10 && (bVar17 && -1 < iVar6)) {
            tint_00 = local_dc;
          }
          position.y = fVar18 + (float)local_78._4_4_;
          position.x = local_c8 + (float)local_78._0_4_;
          in_XMM3_Db = font.recs._4_4_;
          in_XMM3_Dc = font.chars._0_4_;
          in_XMM3_Dd = font.chars._4_4_;
          DrawTextCodepoint(font,codepoint,position,fontSize,tint_00);
        }
LAB_0012a53f:
        if ((wordWrap) && (iVar13 == iVar15)) {
          iVar12 = iVar12 + iVar3;
          local_e8 = (ulong)(uint)((iVar5 - iVar16) + (int)local_e8);
          local_c8 = 0.0;
          uStack_c4 = 0;
          uStack_c0 = 0;
          uStack_bc = 0;
          bVar10 = false;
          iVar14 = 0;
          iVar13 = iVar15;
          iVar16 = iVar5;
          iVar11 = -1;
          local_fc = iVar15;
        }
        else {
          bVar10 = true;
        }
      }
      else {
        bVar1 = 0;
        local_ec = iVar7;
        if ((codepoint < 0x21) && ((0x100000600U >> ((ulong)codepoint & 0x3f) & 1) != 0)) {
          bVar1 = 0;
          iVar15 = iVar13;
        }
LAB_0012a5b1:
        if ((float)local_a8._0_4_ <= (float)iVar14 + local_c8 + 1.0) {
          if (iVar15 < 1) {
            iVar15 = iVar13;
          }
          iVar7 = 0;
          if (iVar13 == iVar15) {
            iVar7 = local_ec;
          }
          iVar11 = iVar15 - iVar7;
          if (local_ec + local_fc == iVar15 - iVar7) {
            iVar11 = iVar6 + -1;
          }
        }
        else {
          bVar17 = local_ec + iVar6 == uVar2;
          iVar11 = iVar15;
          if (bVar17) {
            iVar11 = iVar13;
          }
          bVar10 = false;
          if (!(bool)(bVar1 | bVar17)) goto LAB_0012a620;
        }
        iVar15 = iVar16 + -1;
        iVar14 = 0;
        local_c8 = 0.0;
        uStack_c4 = 0;
        uStack_c0 = 0;
        uStack_bc = 0;
        bVar10 = true;
        iVar13 = local_fc;
        iVar16 = iVar5;
        iVar5 = iVar15;
      }
    }
    else {
      iVar13 = iVar6 + local_ec + -1;
      iVar7 = local_ec;
      if (codepoint != 10) goto LAB_0012a399;
      if (!bVar10) {
        bVar1 = 1;
        iVar14 = 0;
        iVar15 = iVar13;
        goto LAB_0012a5b1;
      }
      iVar14 = 0;
      if (wordWrap) goto LAB_0012a53f;
      iVar12 = iVar12 + iVar3;
      iVar14 = 0;
      local_c8 = 0.0;
      uStack_c4 = 0;
      uStack_c0 = 0;
      uStack_bc = 0;
      bVar10 = true;
    }
LAB_0012a620:
    local_c8 = local_c8 + (float)iVar14;
    iVar16 = iVar16 + 1;
    uVar8 = (ulong)(iVar13 + 1);
    iVar15 = iVar11;
  } while( true );
}

Assistant:

void DrawTextRecEx(Font font, const char *text, Rectangle rec, float fontSize, float spacing, bool wordWrap, Color tint, int selectStart, int selectLength, Color selectTint, Color selectBackTint)
{
    int length = TextLength(text);  // Total length in bytes of the text, scanned by codepoints in loop

    int textOffsetY = 0;            // Offset between lines (on line break '\n')
    float textOffsetX = 0.0f;       // Offset X to next character to draw

    float scaleFactor = fontSize/font.baseSize;     // Character quad scaling factor

    // Word/character wrapping mechanism variables
    enum { MEASURE_STATE = 0, DRAW_STATE = 1 };
    int state = wordWrap? MEASURE_STATE : DRAW_STATE;

    int startLine = -1;         // Index where to begin drawing (where a line begins)
    int endLine = -1;           // Index where to stop drawing (where a line ends)
    int lastk = -1;             // Holds last value of the character position

    for (int i = 0, k = 0; i < length; i++, k++)
    {
        // Get next codepoint from byte string and glyph index in font
        int codepointByteCount = 0;
        int codepoint = GetNextCodepoint(&text[i], &codepointByteCount);
        int index = GetGlyphIndex(font, codepoint);

        // NOTE: Normally we exit the decoding sequence as soon as a bad byte is found (and return 0x3f)
        // but we need to draw all of the bad bytes using the '?' symbol moving one byte
        if (codepoint == 0x3f) codepointByteCount = 1;
        i += (codepointByteCount - 1);

        int glyphWidth = 0;
        if (codepoint != '\n')
        {
            glyphWidth = (font.chars[index].advanceX == 0)?
                         (int)(font.recs[index].width*scaleFactor + spacing):
                         (int)(font.chars[index].advanceX*scaleFactor + spacing);
        }

        // NOTE: When wordWrap is ON we first measure how much of the text we can draw before going outside of the rec container
        // We store this info in startLine and endLine, then we change states, draw the text between those two variables
        // and change states again and again recursively until the end of the text (or until we get outside of the container).
        // When wordWrap is OFF we don't need the measure state so we go to the drawing state immediately
        // and begin drawing on the next line before we can get outside the container.
        if (state == MEASURE_STATE)
        {
            // TODO: There are multiple types of spaces in UNICODE, maybe it's a good idea to add support for more
            // Ref: http://jkorpela.fi/chars/spaces.html
            if ((codepoint == ' ') || (codepoint == '\t') || (codepoint == '\n')) endLine = i;

            if ((textOffsetX + glyphWidth + 1) >= rec.width)
            {
                endLine = (endLine < 1)? i : endLine;
                if (i == endLine) endLine -= codepointByteCount;
                if ((startLine + codepointByteCount) == endLine) endLine = (i - codepointByteCount);

                state = !state;
            }
            else if ((i + 1) == length)
            {
                endLine = i;

                state = !state;
            }
            else if (codepoint == '\n') state = !state;

            if (state == DRAW_STATE)
            {
                textOffsetX = 0;
                i = startLine;
                glyphWidth = 0;

                // Save character position when we switch states
                int tmp = lastk;
                lastk = k - 1;
                k = tmp;
            }
        }
        else
        {
            if (codepoint == '\n')
            {
                if (!wordWrap)
                {
                    textOffsetY += (int)((font.baseSize + font.baseSize/2)*scaleFactor);
                    textOffsetX = 0;
                }
            }
            else
            {
                if (!wordWrap && ((textOffsetX + glyphWidth + 1) >= rec.width))
                {
                    textOffsetY += (int)((font.baseSize + font.baseSize/2)*scaleFactor);
                    textOffsetX = 0;
                }

                // When text overflows rectangle height limit, just stop drawing
                if ((textOffsetY + (int)(font.baseSize*scaleFactor)) > rec.height) break;

                // Draw selection background
                bool isGlyphSelected = false;
                if ((selectStart >= 0) && (k >= selectStart) && (k < (selectStart + selectLength)))
                {
                    DrawRectangleRec((Rectangle){ rec.x + textOffsetX - 1, rec.y + textOffsetY, (float)glyphWidth, (float)font.baseSize*scaleFactor }, selectBackTint);
                    isGlyphSelected = true;
                }

                // Draw current character glyph
                if ((codepoint != ' ') && (codepoint != '\t'))
                {
                    DrawTextCodepoint(font, codepoint, (Vector2){ rec.x + textOffsetX, rec.y + textOffsetY }, fontSize, isGlyphSelected? selectTint : tint);
                }
            }

            if (wordWrap && (i == endLine))
            {
                textOffsetY += (int)((font.baseSize + font.baseSize/2)*scaleFactor);
                textOffsetX = 0;
                startLine = endLine;
                endLine = -1;
                glyphWidth = 0;
                selectStart += lastk - k;
                k = lastk;

                state = !state;
            }
        }

        textOffsetX += glyphWidth;
    }
}